

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O3

exr_result_t
exr_attr_get_m44f(exr_const_context_t_conflict ctxt,int part_index,char *name,exr_attr_m44f_t *out)

{
  exr_attr_m33d_t *peVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  exr_result_t eVar9;
  exr_attribute_t *in_RAX;
  exr_context_t nonc;
  exr_attribute_t *attr;
  exr_attribute_t *local_28;
  
  if (ctxt == (exr_const_context_t_conflict)0x0) {
    return 2;
  }
  local_28 = in_RAX;
  if (ctxt->mode == '\x01') {
    pthread_mutex_lock((pthread_mutex_t *)&ctxt->mutex);
  }
  if ((part_index < 0) || (ctxt->num_parts <= part_index)) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar9 = (*ctxt->print_error)
                      (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                       ctxt->print_error);
    return eVar9;
  }
  if ((name == (char *)0x0) || (*name == '\0')) {
    if (ctxt->mode == '\x01') {
      pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
    }
    eVar9 = (*ctxt->report_error)(ctxt,3,"Invalid name for m44f attribute query");
    return eVar9;
  }
  eVar9 = exr_attr_list_find_by_name(ctxt,&ctxt->parts[(uint)part_index]->attributes,name,&local_28)
  ;
  if (eVar9 == 0) {
    if (local_28->type != EXR_ATTR_M44F) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar9 = (*ctxt->print_error)
                        (ctxt,0x10,
                         "\'%s\' requested type \'m44f\', but stored attributes is type \'%s\'",name
                         ,local_28->type_name);
      return eVar9;
    }
    if (out == (exr_attr_m44f_t *)0x0) {
      if (ctxt->mode == '\x01') {
        pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
      }
      eVar9 = (*ctxt->print_error)(ctxt,3,"NULL output for \'%s\'",name);
      return eVar9;
    }
    peVar1 = (local_28->field_6).m33d;
    dVar2 = peVar1->m[0];
    dVar3 = peVar1->m[1];
    dVar4 = peVar1->m[2];
    dVar5 = peVar1->m[3];
    dVar6 = peVar1->m[4];
    dVar7 = peVar1->m[5];
    dVar8 = peVar1->m[7];
    *(double *)(out->m + 0xc) = peVar1->m[6];
    *(double *)(out->m + 0xe) = dVar8;
    *(double *)(out->m + 8) = dVar6;
    *(double *)(out->m + 10) = dVar7;
    *(double *)(out->m + 4) = dVar4;
    *(double *)(out->m + 6) = dVar5;
    *(double *)out->m = dVar2;
    *(double *)(out->m + 2) = dVar3;
    eVar9 = 0;
  }
  if (ctxt->mode == '\x01') {
    pthread_mutex_unlock((pthread_mutex_t *)&ctxt->mutex);
  }
  return eVar9;
}

Assistant:

exr_result_t
exr_attr_get_m44f (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    exr_attr_m44f_t*    out)
{
    ATTR_GET_IMPL_DEREF (EXR_ATTR_M44F, m44f);
}